

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O0

double atan2(double __y,double __x)

{
  double dVar1;
  int iVar2;
  double *pdVar3;
  Fad<double> *in_RDX;
  Fad<double> *in_RSI;
  Fad<double> *pFVar4;
  Fad<double> *this;
  int i;
  STATE r;
  STATE angle;
  STATE yval;
  STATE xval;
  int sz;
  Fad<double> *result;
  int in_stack_ffffffffffffff2c;
  Fad<double> *in_stack_ffffffffffffff30;
  double *in_stack_ffffffffffffff40;
  double dVar5;
  undefined8 in_stack_ffffffffffffff48;
  int sz_00;
  double dVar6;
  Fad<double> *in_stack_ffffffffffffff50;
  undefined4 local_4c;
  
  sz_00 = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  iVar2 = Fad<double>::size((Fad<double> *)0x1e6d413);
  pdVar3 = Fad<double>::val(in_RDX);
  dVar1 = *pdVar3;
  pdVar3 = Fad<double>::val(in_RSI);
  atan2(*pdVar3,dVar1);
  Fad<double>::Fad(in_stack_ffffffffffffff50,sz_00,in_stack_ffffffffffffff40);
  pdVar3 = Fad<double>::val(in_RDX);
  dVar1 = *pdVar3;
  pdVar3 = Fad<double>::val(in_RDX);
  dVar5 = *pdVar3;
  pdVar3 = Fad<double>::val(in_RSI);
  dVar6 = *pdVar3;
  pdVar3 = Fad<double>::val(in_RSI);
  pFVar4 = (Fad<double> *)(dVar1 * dVar5 + dVar6 * *pdVar3);
  this = pFVar4;
  for (local_4c = 0; local_4c < iVar2; local_4c = local_4c + 1) {
    pdVar3 = Fad<double>::val(in_RSI);
    dVar1 = *pdVar3;
    pdVar3 = Fad<double>::fastAccessDx(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    dVar5 = *pdVar3;
    pdVar3 = Fad<double>::val(in_RDX);
    dVar6 = *pdVar3;
    pdVar3 = Fad<double>::fastAccessDx(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    this = (Fad<double> *)((-dVar1 * dVar5 + dVar6 * *pdVar3) / (double)pFVar4);
    pdVar3 = Fad<double>::fastAccessDx(this,in_stack_ffffffffffffff2c);
    *pdVar3 = (double)this;
    in_stack_ffffffffffffff30 = this;
  }
  return (double)this;
}

Assistant:

static Fad<STATE> atan2(Fad<STATE> y, Fad<STATE> x)
{
    int sz = x.size();
    STATE xval,yval;
    xval = x.val();
    yval = y.val();
    STATE angle = atan2(yval,xval);
    Fad<STATE> result(sz,angle);
    STATE r = x.val()*x.val()+y.val()*y.val();
    for (int i=0; i<sz; i++) {
        result.fastAccessDx(i) = (-y.val()*x.fastAccessDx(i) + x.val()*y.fastAccessDx(i))/r;
    }
    return result;
}